

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_page_by_mmuidx_all_cpus_synced_ppc
               (CPUState_conflict *src_cpu,target_ulong_conflict addr,uint16_t idxmap)

{
  uint uVar1;
  run_on_cpu_data data;
  run_on_cpu_data rVar2;
  TLBFlushPageByMMUIdxData_conflict *d;
  uint16_t idxmap_local;
  target_ulong_conflict addr_local;
  CPUState_conflict *src_cpu_local;
  
  uVar1 = addr & 0xfffff000;
  if (idxmap < 0x1000) {
    rVar2._0_4_ = uVar1 | idxmap;
    rVar2.host_ulong._4_4_ = 0;
    flush_all_helper(src_cpu,tlb_flush_page_by_mmuidx_async_1,rVar2);
    data._0_4_ = uVar1 | idxmap;
    data.host_ulong._4_4_ = 0;
    tlb_flush_page_by_mmuidx_async_1(src_cpu,data);
  }
  else {
    rVar2.host_ptr = g_malloc_n(1,8);
    *(uint *)rVar2.host_ptr = uVar1;
    *(uint16_t *)(rVar2.host_ulong + 4) = idxmap;
    tlb_flush_page_by_mmuidx_async_2(src_cpu,rVar2);
  }
  return;
}

Assistant:

void tlb_flush_page_by_mmuidx_all_cpus_synced(CPUState *src_cpu,
                                              target_ulong addr,
                                              uint16_t idxmap)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = src_cpu->uc;
#endif

    /* This should already be page aligned */
    addr &= TARGET_PAGE_MASK;

    /*
     * Allocate memory to hold addr+idxmap only when needed.
     * See tlb_flush_page_by_mmuidx for details.
     */
    if (idxmap < TARGET_PAGE_SIZE) {
        flush_all_helper(src_cpu, tlb_flush_page_by_mmuidx_async_1,
                         RUN_ON_CPU_TARGET_PTR(addr | idxmap));
        tlb_flush_page_by_mmuidx_async_1(src_cpu, RUN_ON_CPU_TARGET_PTR(addr | idxmap));
    } else {
        //CPUState *dst_cpu;
        TLBFlushPageByMMUIdxData *d;

#if 0
        /* Allocate a separate data block for each destination cpu.  */
        CPU_FOREACH(dst_cpu) {
            if (dst_cpu != src_cpu) {
                d = g_new(TLBFlushPageByMMUIdxData, 1);
                d->addr = addr;
                d->idxmap = idxmap;
                tlb_flush_page_by_mmuidx_async_2(dst_cpu, RUN_ON_CPU_HOST_PTR(d));
            }
        }
#endif

        d = g_new(TLBFlushPageByMMUIdxData, 1);
        d->addr = addr;
        d->idxmap = idxmap;
        tlb_flush_page_by_mmuidx_async_2(src_cpu, RUN_ON_CPU_HOST_PTR(d));
    }
}